

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerExpression.cpp
# Opt level: O0

BaseExpressionPtr __thiscall
Kandinsky::PowerExpression::derivative(PowerExpression *this,VariableExpressionPtr *variable)

{
  element_type *peVar1;
  Expression *arg;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  BaseExpressionPtr BVar2;
  shared_ptr<Kandinsky::BaseExpression> *arg_00;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 uVar3;
  shared_ptr<Kandinsky::BaseExpression> *in_stack_fffffffffffffe38;
  undefined1 local_188 [24];
  shared_ptr<Kandinsky::BaseExpression> *in_stack_fffffffffffffe90;
  Expression *in_stack_fffffffffffffe98;
  Expression *in_stack_fffffffffffffea0;
  Expression *in_stack_fffffffffffffea8;
  Expression *in_stack_fffffffffffffeb0;
  Expression *in_stack_fffffffffffffeb8;
  int *in_stack_fffffffffffffed0;
  shared_ptr<Kandinsky::BaseExpression> *in_stack_fffffffffffffed8;
  Expression *in_stack_fffffffffffffef0;
  Expression *in_stack_fffffffffffffef8;
  undefined1 local_f0 [148];
  undefined4 local_5c;
  shared_ptr<Kandinsky::BaseExpression> local_58 [4];
  undefined8 local_18;
  
  local_18 = in_RDX;
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x12fa32);
  arg_00 = local_58;
  (*peVar1->_vptr_BaseExpression[1])(arg_00,peVar1,local_18);
  local_5c = 0;
  operator!=<std::shared_ptr<Kandinsky::BaseExpression>,_int,_nullptr>
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  pow<std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (in_stack_fffffffffffffe38,
             (shared_ptr<Kandinsky::BaseExpression> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x12faa7);
  (*peVar1->_vptr_BaseExpression[1])(local_f0,peVar1,local_18);
  log<std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>(arg_00);
  operator*<std::shared_ptr<Kandinsky::BaseExpression>,_Kandinsky::NaturalLogarithmExpression,_nullptr>
            ((shared_ptr<Kandinsky::BaseExpression> *)in_stack_fffffffffffffef8,
             (NaturalLogarithmExpression *)in_stack_fffffffffffffef0);
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x12fb16);
  (*peVar1->_vptr_BaseExpression[1])(&stack0xfffffffffffffeb8,peVar1,local_18);
  operator*<std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            ((shared_ptr<Kandinsky::BaseExpression> *)in_stack_fffffffffffffef8,
             (shared_ptr<Kandinsky::BaseExpression> *)in_stack_fffffffffffffef0);
  operator/<Kandinsky::Expression,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  operator+<Kandinsky::Expression,_Kandinsky::Expression,_nullptr>
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  operator*<Kandinsky::PowerExpression,_Kandinsky::Expression,_nullptr>
            ((PowerExpression *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x12fbc8);
  (*peVar1->_vptr_BaseExpression[1])(local_188,peVar1,local_18);
  operator*<std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            ((shared_ptr<Kandinsky::BaseExpression> *)in_stack_fffffffffffffef8,
             (shared_ptr<Kandinsky::BaseExpression> *)in_stack_fffffffffffffef0);
  arg = (Expression *)(in_RSI + 8);
  uVar3 = 1;
  operator-<std::shared_ptr<Kandinsky::BaseExpression>,_int,_nullptr>
            ((shared_ptr<Kandinsky::BaseExpression> *)in_stack_fffffffffffffea8,
             (int *)in_stack_fffffffffffffea0);
  pow<std::shared_ptr<Kandinsky::BaseExpression>,_Kandinsky::Expression,_nullptr>
            (in_stack_fffffffffffffe38,(Expression *)CONCAT44(uVar3,in_stack_fffffffffffffe30));
  operator*<Kandinsky::Expression,_Kandinsky::PowerExpression,_nullptr>
            (in_stack_fffffffffffffef8,(PowerExpression *)in_stack_fffffffffffffef0);
  ifThenElse<Kandinsky::Expression,_Kandinsky::Expression,_Kandinsky::Expression,_nullptr>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  BaseExpression::makePtr<Kandinsky::Expression>(arg);
  Expression::~Expression((Expression *)0x12fca8);
  Expression::~Expression((Expression *)0x12fcb5);
  ~PowerExpression((PowerExpression *)0x12fcbf);
  Expression::~Expression((Expression *)0x12fcc9);
  Expression::~Expression((Expression *)0x12fcd6);
  std::shared_ptr<Kandinsky::BaseExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::BaseExpression> *)0x12fce3);
  Expression::~Expression((Expression *)0x12fcf0);
  Expression::~Expression((Expression *)0x12fcfd);
  Expression::~Expression((Expression *)0x12fd0a);
  Expression::~Expression((Expression *)0x12fd17);
  std::shared_ptr<Kandinsky::BaseExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::BaseExpression> *)0x12fd24);
  Expression::~Expression((Expression *)0x12fd31);
  NaturalLogarithmExpression::~NaturalLogarithmExpression((NaturalLogarithmExpression *)0x12fd3e);
  std::shared_ptr<Kandinsky::BaseExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::BaseExpression> *)0x12fd4b);
  ~PowerExpression((PowerExpression *)0x12fd58);
  Expression::~Expression((Expression *)0x12fd65);
  std::shared_ptr<Kandinsky::BaseExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::BaseExpression> *)0x12fd72);
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (BaseExpressionPtr)
         BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr PowerExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(ifThenElse(m_arg2->derivative(variable) != 0,
                pow(m_arg1, m_arg2) * (
                m_arg2->derivative(variable) * log(m_arg1) +
                m_arg2 * m_arg1->derivative(variable) / m_arg1),
                m_arg2 * m_arg1->derivative(variable) * pow(m_arg1, m_arg2 - 1)));
    }